

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void state_SINCOS(Context *ctx)

{
  int iVar1;
  char *reason;
  undefined8 uStack_10;
  
  if ((ctx->dest_arg).writemask - 1U < 3) {
    iVar1 = replicate_swizzle(ctx->source_args[0].swizzle);
    if (iVar1 == 0) {
      reason = "SINCOS src0 must have replicate swizzle";
    }
    else {
      if (((ctx->dest_arg).result_mod & 1) == 0) {
        iVar1 = shader_version_atleast(ctx,'\x03','\0');
        if (iVar1 != 0) {
          return;
        }
        if (ctx->source_args[1].regtype == REG_TYPE_CONST) {
          if (ctx->source_args[2].regtype == REG_TYPE_CONST) {
            if (ctx->source_args[1].regnum != ctx->source_args[2].regnum) {
              return;
            }
            reason = "SINCOS src1 and src2 must be different registers";
            goto LAB_00111ad0;
          }
          uStack_10 = 2;
        }
        else {
          uStack_10 = 1;
        }
        failf(ctx,"SINCOS src%d must be constfloat",uStack_10);
        return;
      }
      reason = "SINCOS destination can\'t use saturate modifier";
    }
  }
  else {
    reason = "SINCOS write mask must be .x or .y or .xy";
  }
LAB_00111ad0:
  fail(ctx,reason);
  return;
}

Assistant:

static void state_SINCOS(Context *ctx)
{
    const DestArgInfo *dst = &ctx->dest_arg;
    const int mask = dst->writemask;
    if (!writemask_x(mask) && !writemask_y(mask) && !writemask_xy(mask))
        fail(ctx, "SINCOS write mask must be .x or .y or .xy");

    else if (!replicate_swizzle(ctx->source_args[0].swizzle))
        fail(ctx, "SINCOS src0 must have replicate swizzle");

    else if (dst->result_mod & MOD_SATURATE)  // according to msdn...
        fail(ctx, "SINCOS destination can't use saturate modifier");

    // this opcode needs extra registers, with extra limitations, for <= sm2.
    else if (!shader_version_atleast(ctx, 3, 0))
    {
        int i;
        for (i = 1; i < 3; i++)
        {
            if (ctx->source_args[i].regtype != REG_TYPE_CONST)
            {
                failf(ctx, "SINCOS src%d must be constfloat", i);
                return;
            } // if
        } // for

        if (ctx->source_args[1].regnum == ctx->source_args[2].regnum)
            fail(ctx, "SINCOS src1 and src2 must be different registers");
    } // if
}